

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

bilingual_str * common::PSBTErrorString(bilingual_str *__return_storage_ptr__,PSBTError err)

{
  string *this;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff48;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(err) {
  case MISSING_INPUTS:
    std::__cxx11::string::string<std::allocator<char>>
              (local_30,"Inputs missing or spent",(allocator<char> *)&stack0xffffffffffffff4f);
    Untranslated(__return_storage_ptr__,in_stack_ffffffffffffff48);
    this = local_30;
    break;
  case SIGHASH_MISMATCH:
    std::__cxx11::string::string<std::allocator<char>>
              (local_50,"Specified sighash value does not match value stored in PSBT",
               (allocator<char> *)&stack0xffffffffffffff4f);
    Untranslated(__return_storage_ptr__,in_stack_ffffffffffffff48);
    this = local_50;
    break;
  case EXTERNAL_SIGNER_NOT_FOUND:
    std::__cxx11::string::string<std::allocator<char>>
              (local_70,"External signer not found",(allocator<char> *)&stack0xffffffffffffff4f);
    Untranslated(__return_storage_ptr__,in_stack_ffffffffffffff48);
    this = local_70;
    break;
  case EXTERNAL_SIGNER_FAILED:
    std::__cxx11::string::string<std::allocator<char>>
              (local_90,"External signer failed to sign",(allocator<char> *)&stack0xffffffffffffff4f
              );
    Untranslated(__return_storage_ptr__,in_stack_ffffffffffffff48);
    this = local_90;
    break;
  case UNSUPPORTED:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffff50,"Signer does not support PSBT",
               (allocator<char> *)&stack0xffffffffffffff4f);
    Untranslated(__return_storage_ptr__,in_stack_ffffffffffffff48);
    this = (string *)&stack0xffffffffffffff50;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/messages.cpp"
                  ,0x79,"bilingual_str common::PSBTErrorString(PSBTError)");
  }
  std::__cxx11::string::~string(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

bilingual_str PSBTErrorString(PSBTError err)
{
    switch (err) {
        case PSBTError::MISSING_INPUTS:
            return Untranslated("Inputs missing or spent");
        case PSBTError::SIGHASH_MISMATCH:
            return Untranslated("Specified sighash value does not match value stored in PSBT");
        case PSBTError::EXTERNAL_SIGNER_NOT_FOUND:
            return Untranslated("External signer not found");
        case PSBTError::EXTERNAL_SIGNER_FAILED:
            return Untranslated("External signer failed to sign");
        case PSBTError::UNSUPPORTED:
            return Untranslated("Signer does not support PSBT");
        // no default case, so the compiler can warn about missing cases
    }
    assert(false);
}